

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

uint32_t FAPOBase_GetRegistrationProperties
                   (FAPOBase *fapo,FAPORegistrationProperties **ppRegistrationProperties)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  long in_RDI;
  
  uVar1 = (**(code **)(in_RDI + 200))(0x42c);
  *in_RSI = uVar1;
  SDL_memcpy(*in_RSI,*(undefined8 *)(in_RDI + 0x80),0x42c);
  return 0;
}

Assistant:

uint32_t FAPOBase_GetRegistrationProperties(
	FAPOBase *fapo,
	FAPORegistrationProperties **ppRegistrationProperties
) {
	*ppRegistrationProperties = (FAPORegistrationProperties*) fapo->pMalloc(
		sizeof(FAPORegistrationProperties)
	);
	FAudio_memcpy(
		*ppRegistrationProperties,
		fapo->m_pRegistrationProperties,
		sizeof(FAPORegistrationProperties)
	);
	return 0;
}